

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  FILE *fp;
  FlagSaver fs;
  string filename;
  string local_2038 [255];
  undefined1 local_39;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","DeprecatedFunctionsTest","AppendFlagsIntoFile");
  fLI::FLAGS_test_int32 = 10;
  std::__cxx11::string::string((string *)local_2038,"flagfile",(allocator *)&fp);
  TmpFile(&filename,local_2038);
  std::__cxx11::string::~string((string *)local_2038);
  unlink(filename._M_dataplus._M_p);
  bVar1 = AppendFlagsIntoFile(&filename,"not the real argv0");
  if (bVar1) {
    iVar2 = SafeFOpen(&fp,filename._M_dataplus._M_p,"r");
    if (iVar2 != 0) {
      fprintf(_stderr,"Check failed: %s %s %s\n","0","==","SafeFOpen(&fp, filename.c_str(), \"r\")")
      ;
      goto LAB_00138953;
    }
    if (fp == (FILE *)0x0) {
      pcVar3 = "fp != NULL";
    }
    else {
      pcVar3 = fgets((char *)local_2038,0x1fff,(FILE *)fp);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = "fgets(line, sizeof(line)-1, fp) != NULL";
      }
      else {
        iVar2 = bcmp("not the real argv0\n",local_2038,0x14);
        if (iVar2 != 0) {
          fprintf(_stderr,"Check failed: streq(%s, %s)\n","\"not the real argv0\\n\"","line");
          goto LAB_00138953;
        }
        bVar1 = false;
        bVar4 = false;
        while( true ) {
          pcVar3 = fgets((char *)local_2038,0x1fff,(FILE *)fp);
          if (pcVar3 == (char *)0x0) break;
          local_39 = 0;
          iVar2 = bcmp(local_2038,"--test_bool=false\n",0x13);
          bVar1 = (bool)(bVar1 | iVar2 == 0);
          iVar2 = bcmp(local_2038,"--test_int32=10\n",0x11);
          bVar4 = (bool)(bVar4 | iVar2 == 0);
        }
        if (bVar4) {
          if (bVar1) {
            fclose((FILE *)fp);
            std::__cxx11::string::~string((string *)&filename);
            FlagSaver::~FlagSaver(&fs);
            return;
          }
          pcVar3 = "found_bool";
        }
        else {
          pcVar3 = "found_int32";
        }
      }
    }
  }
  else {
    pcVar3 = "r";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
LAB_00138953:
  exit(1);
}

Assistant:

TEST(DeprecatedFunctionsTest, AppendFlagsIntoFile) {
  FLAGS_test_int32 = 10;     // just to make the test more interesting
  string filename(TmpFile("flagfile"));
  unlink(filename.c_str());  // just to be safe
  const bool r = AppendFlagsIntoFile(filename, "not the real argv0");
  EXPECT_TRUE(r);

  FILE* fp;
  EXPECT_EQ(0, SafeFOpen(&fp, filename.c_str(), "r"));
  EXPECT_TRUE(fp != NULL);
  char line[8192];
  EXPECT_TRUE(fgets(line, sizeof(line)-1, fp) != NULL);  // get the first line
  // First line should be progname.
  EXPECT_STREQ("not the real argv0\n", line);

  bool found_bool = false, found_int32 = false;
  while (fgets(line, sizeof(line)-1, fp)) {
    line[sizeof(line)-1] = '\0';    // just to be safe
    if (strcmp(line, "--test_bool=false\n") == 0)
      found_bool = true;
    if (strcmp(line, "--test_int32=10\n") == 0)
      found_int32 = true;
  }
  EXPECT_TRUE(found_int32);
  EXPECT_TRUE(found_bool);
  fclose(fp);
}